

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_bc7enc.cpp
# Opt level: O1

uint64_t basisu::pack_astc_range7_2bit_to_one_color
                   (color_cell_compressor_params *pParams,color_cell_compressor_results *pResults,
                   uint32_t r,uint32_t g,uint32_t b,uint8_t *pSelectors)

{
  uint8_t uVar1;
  uint8_t uVar2;
  color_quad_u8 *pcVar3;
  long lVar4;
  uint64_t uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  color_quad_u8 p;
  byte local_4c [28];
  
  if ((pParams->m_astc_endpoint_range == 7) && (pParams->m_num_selector_weights == 4)) {
    uVar1 = (&DAT_0036bd62)[(ulong)g * 4];
    uVar2 = (&DAT_0036bd62)[(ulong)b * 4];
    (pResults->m_low_endpoint).m_c[0] = (&DAT_0036bd62)[(ulong)r * 4];
    (pResults->m_low_endpoint).m_c[1] = uVar1;
    (pResults->m_low_endpoint).m_c[2] = uVar2;
    (pResults->m_low_endpoint).m_c[3] = '\0';
    uVar1 = (&DAT_0036bd63)[(ulong)g * 4];
    uVar2 = (&DAT_0036bd63)[(ulong)b * 4];
    (pResults->m_high_endpoint).m_c[0] = (&DAT_0036bd63)[(ulong)r * 4];
    (pResults->m_high_endpoint).m_c[1] = uVar1;
    (pResults->m_high_endpoint).m_c[2] = uVar2;
    *(undefined1 *)((long)pResults->m_pbits + 7) = 0;
    *(undefined8 *)((pResults->m_high_endpoint).m_c + 3) = 0;
    lVar4 = 0x2c;
    do {
      *(undefined *)((long)(&pResults->m_low_endpoint + -3) + lVar4) =
           (&DAT_00368361)
           [(ulong)*(byte *)((long)(&pResults->m_low_endpoint + -0xb) + lVar4) * 2 +
            (ulong)pParams->m_astc_endpoint_range * 0x200];
      *(undefined *)
       ((long)&((color_cell_compressor_results *)(&pResults->m_low_endpoint + -2))->
               m_best_overall_err + lVar4) =
           (&DAT_00368361)
           [(ulong)*(byte *)((long)(&pResults->m_low_endpoint + -10) + lVar4) * 2 +
            (ulong)pParams->m_astc_endpoint_range * 0x200];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x30);
    memset(pSelectors,1,(ulong)pParams->m_num_pixels);
    lVar4 = 0;
    do {
      local_4c[lVar4] =
           (byte)((uint)CONCAT11((&DAT_00369160)[(ulong)(pResults->m_high_endpoint).m_c[lVar4] * 2],
                                 (&DAT_00369160)[(ulong)(pResults->m_high_endpoint).m_c[lVar4] * 2])
                  * 0x15 + (uint)CONCAT11((&DAT_00369160)
                                          [(ulong)(pResults->m_low_endpoint).m_c[lVar4] * 2],
                                          (&DAT_00369160)
                                          [(ulong)(pResults->m_low_endpoint).m_c[lVar4] * 2]) * 0x2b
                  + 0x20 >> 0xe);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    if ((ulong)pParams->m_num_pixels == 0) {
      uVar5 = 0;
    }
    else {
      pcVar3 = pParams->m_pPixels;
      iVar7 = (uint)local_4c[2] + ((uint)local_4c[2] + (uint)local_4c[2] * 8) * 4 +
              (uint)local_4c[1] * 0x16e + (uint)local_4c[0] * 0x6d;
      uVar10 = 0;
      uVar5 = 0;
      do {
        uVar8 = (uint)pcVar3[uVar10].m_c[0];
        if (pParams->m_perceptual == '\0') {
          iVar9 = local_4c[0] - uVar8;
          iVar11 = (uint)local_4c[1] - (uint)pcVar3[uVar10].m_c[1];
          iVar6 = (uint)local_4c[2] - (uint)pcVar3[uVar10].m_c[2];
        }
        else {
          iVar6 = (uint)pcVar3[uVar10].m_c[2] * 0x25 +
                  (uint)pcVar3[uVar10].m_c[1] * 0x16e + uVar8 * 0x6d;
          iVar9 = iVar7 - iVar6 >> 8;
          iVar11 = (int)(((local_4c[0] - uVar8) * 0x200 - iVar7) + iVar6) >> 8;
          iVar6 = (int)(((uint)local_4c[2] * 0x200 - ((uint)pcVar3[uVar10].m_c[2] * 0x200 + iVar7))
                       + iVar6) >> 8;
        }
        uVar5 = uVar5 + (iVar6 * iVar6 * pParams->m_weights[2] +
                        iVar11 * iVar11 * pParams->m_weights[1] +
                        iVar9 * iVar9 * pParams->m_weights[0]);
        uVar10 = uVar10 + 1;
      } while (pParams->m_num_pixels != uVar10);
    }
    pResults->m_best_overall_err = uVar5;
    return uVar5;
  }
  __assert_fail("pParams->m_astc_endpoint_range == 7 && pParams->m_num_selector_weights == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_bc7enc.cpp"
                ,0x2c1,
                "uint64_t basisu::pack_astc_range7_2bit_to_one_color(const color_cell_compressor_params *, color_cell_compressor_results *, uint32_t, uint32_t, uint32_t, uint8_t *)"
               );
}

Assistant:

static uint64_t pack_astc_range7_2bit_to_one_color(const color_cell_compressor_params *pParams, color_cell_compressor_results *pResults, uint32_t r, uint32_t g, uint32_t b, uint8_t *pSelectors)
{
	assert(pParams->m_astc_endpoint_range == 7 && pParams->m_num_selector_weights == 4);

	const endpoint_err *pEr = &g_astc_range7_2bit_optimal_endpoints[r];
	const endpoint_err *pEg = &g_astc_range7_2bit_optimal_endpoints[g];
	const endpoint_err *pEb = &g_astc_range7_2bit_optimal_endpoints[b];

	color_quad_u8_set(&pResults->m_low_endpoint, pEr->m_lo, pEg->m_lo, pEb->m_lo, 0);
	color_quad_u8_set(&pResults->m_high_endpoint, pEr->m_hi, pEg->m_hi, pEb->m_hi, 0);
	pResults->m_pbits[0] = 0;
	pResults->m_pbits[1] = 0;

	for (uint32_t i = 0; i < 4; i++)
	{
		pResults->m_astc_low_endpoint.m_c[i] = g_astc_sorted_order_unquant[pParams->m_astc_endpoint_range][pResults->m_low_endpoint.m_c[i]].m_index;
		pResults->m_astc_high_endpoint.m_c[i] = g_astc_sorted_order_unquant[pParams->m_astc_endpoint_range][pResults->m_high_endpoint.m_c[i]].m_index;
	}

	memset(pSelectors, BC7ENC_ASTC_RANGE7_2BIT_OPTIMAL_INDEX, pParams->m_num_pixels);

	color_quad_u8 p;
	for (uint32_t i = 0; i < 3; i++)
	{
		uint32_t low = g_astc_sorted_order_unquant[7][pResults->m_low_endpoint.m_c[i]].m_unquant;
		uint32_t high = g_astc_sorted_order_unquant[7][pResults->m_high_endpoint.m_c[i]].m_unquant;
		
		p.m_c[i] = (uint8_t)astc_interpolate_linear(low, high, g_bc7_weights2[BC7ENC_ASTC_RANGE7_2BIT_OPTIMAL_INDEX]);
	}
	p.m_c[3] = 255;

	uint64_t total_err = 0;
	for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		total_err += compute_color_distance_rgb(&p, &pParams->m_pPixels[i], pParams->m_perceptual, pParams->m_weights);

	pResults->m_best_overall_err = total_err;

	return total_err;
}